

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O1

shared_ptr<pstore::index::details::internal_node> __thiscall
anon_unknown.dwarf_18e2c8::CorruptInternalNodes::load_inode
          (CorruptInternalNodes *this,index_pointer ptr)

{
  string *psVar1;
  ulong in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<void> sVar3;
  shared_ptr<pstore::index::details::internal_node> sVar4;
  _func_int **local_20;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> local_18;
  
  if ((in_RDX & 1) == 0) {
    pstore::assert_failed
              ("ptr.is_internal ()",
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x6b0);
  }
  if ((in_RDX & 2) == 0) {
    sVar3 = pstore::database::getrw
                      ((database *)&stack0xffffffffffffffe0,(address)&ptr.internal_[2].bitmap_,
                       in_RDX & 0xfffffffffffffffc);
    _Var2 = sVar3.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->super_GenericIndexFixture).super_IndexFixture.super_Test._vptr_Test = local_20;
    (this->super_GenericIndexFixture).super_IndexFixture.super_Test.gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
         (GTestFlagSaver *)local_18._M_head_impl;
    if ((tuple<std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         )local_18._M_head_impl !=
        (_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        psVar1 = (string *)((long)(local_18._M_head_impl)->_M_elems + 8);
        *(int *)&(psVar1->_M_dataplus)._M_p = *(int *)&(psVar1->_M_dataplus)._M_p + 1;
        UNLOCK();
      }
      else {
        psVar1 = (string *)((long)(local_18._M_head_impl)->_M_elems + 8);
        *(int *)&(psVar1->_M_dataplus)._M_p = *(int *)&(psVar1->_M_dataplus)._M_p + 1;
      }
    }
    if ((_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)local_18._M_head_impl !=
        (_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18._M_head_impl);
      _Var2._M_pi = extraout_RDX;
    }
    sVar4.super___shared_ptr<pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
    sVar4.super___shared_ptr<pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (shared_ptr<pstore::index::details::internal_node>)
           sVar4.
           super___shared_ptr<pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("is_address ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                ,0xe3,"address pstore::index::details::index_pointer::to_address() const");
}

Assistant:

std::shared_ptr<internal_node> CorruptInternalNodes::load_inode (index_pointer ptr) {
        PSTORE_ASSERT (ptr.is_internal ());
        return std::static_pointer_cast<internal_node> (
            db_.getrw (ptr.untag_address<internal_node> ().to_address (),
                       internal_node::size_bytes (internal_node_children)));
    }